

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_mix_2_0_to_3_0(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float c;
  float ri;
  float li;
  uint32_t i;
  float *fc;
  float *fr;
  float *fl;
  float *r;
  float *l;
  undefined8 *puStack_18;
  uint32_t frames;
  channel_data *data;
  mixed_segment *segment_local;
  
  puStack_18 = (undefined8 *)segment->data;
  l._4_4_ = -NAN;
  data = (channel_data *)segment;
  mixed_buffer_request_read(&r,(uint32_t *)((long)&l + 4),(mixed_buffer *)*puStack_18);
  mixed_buffer_request_read(&fl,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[1]);
  mixed_buffer_request_write(&fr,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0xe]);
  mixed_buffer_request_write(&fc,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0xf]);
  mixed_buffer_request_write
            ((float **)&li,(uint32_t *)((long)&l + 4),(mixed_buffer *)puStack_18[0x10]);
  for (ri = 0.0; (uint)ri < (uint)l._4_4_; ri = (float)((int)ri + 1)) {
    fVar1 = r[(uint)ri];
    fVar2 = fl[(uint)ri];
    fr[(uint)ri] = fVar1;
    fc[(uint)ri] = fVar2;
    _li[(uint)ri] = (fVar1 + fVar2) * 0.5;
  }
  mixed_buffer_finish_read((uint32_t)l._4_4_,(mixed_buffer *)*puStack_18);
  mixed_buffer_finish_read((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[1]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0xe]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0xf]);
  mixed_buffer_finish_write((uint32_t)l._4_4_,(mixed_buffer *)puStack_18[0x10]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_3_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  
  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict fc;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&fc, &frames, data->out[2]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];
    float c = (li+ri)*0.5f;

    fl[i] = li;
    fr[i] = ri;
    fc[i] = c;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[2]);

  return 1;
}